

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O1

bool cmFileTimes::Copy(string *fromFile,string *toFile)

{
  bool bVar1;
  int iVar2;
  cmFileTimes fileTimes;
  _Head_base<0UL,_cmFileTimes::Times_*,_false> local_10;
  
  local_10._M_head_impl = (Times *)0x0;
  bVar1 = Load((cmFileTimes *)&local_10,fromFile);
  if ((bVar1) && ((utimbuf *)local_10._M_head_impl != (utimbuf *)0x0)) {
    iVar2 = utime((toFile->_M_dataplus)._M_p,(utimbuf *)local_10._M_head_impl);
    bVar1 = -1 < iVar2;
  }
  else {
    bVar1 = false;
  }
  if ((utimbuf *)local_10._M_head_impl != (utimbuf *)0x0) {
    operator_delete(local_10._M_head_impl,0x10);
  }
  return bVar1;
}

Assistant:

bool cmFileTimes::Copy(std::string const& fromFile, std::string const& toFile)
{
  cmFileTimes fileTimes;
  return (fileTimes.Load(fromFile) && fileTimes.Store(toFile));
}